

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Qentem::Array<unsigned_int>::operator+=(Array<unsigned_int> *this,Array<unsigned_int> *src)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  SizeT new_size;
  
  new_size = src->index_ + this->index_;
  if (this->capacity_ < new_size) {
    resize(this,new_size);
    new_size = this->index_ + src->index_;
  }
  this->index_ = new_size;
  if ((ulong)src->index_ != 0) {
    puVar3 = src->storage_;
    puVar4 = this->storage_;
    puVar1 = puVar3 + src->index_;
    do {
      uVar2 = *puVar3;
      puVar3 = puVar3 + 1;
      *puVar4 = uVar2;
      puVar4 = puVar4 + 1;
    } while (puVar3 < puVar1);
  }
  return;
}

Assistant:

void operator+=(const Array &src) {
        const SizeT n_size = (Size() + src.Size());

        if (n_size > Capacity()) {
            resize(n_size);
        }

        index_ += src.Size();

        Type_T       *storage  = Storage();
        const Type_T *src_item = src.First();
        const Type_T *src_end  = (src_item + src.Size());

        while (src_item < src_end) {
            Memory::Initialize(storage, *src_item);
            ++storage;
            ++src_item;
        }
    }